

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O1

void __thiscall
libtorrent::i2p_stream::
send_session_create<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (i2p_stream *this,
          _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *h)

{
  uint uVar1;
  uint uVar2;
  error_code local_210;
  write_op<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_libtorrent::aux::wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:433:4),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>_>
  local_200;
  char cmd [400];
  
  this->m_state = read_session_create_response;
  uVar2 = snprintf(cmd,400,
                   "SESSION CREATE STYLE=STREAM ID=%s DESTINATION=TRANSIENT SIGNATURE_TYPE=7 i2cp.leaseSetEncType=4,0 inbound.quantity=%d outbound.quantity=%d inbound.length=%d outbound.length=%d\n"
                   ,this->m_id,(ulong)(uint)(this->m_session_options).m_inbound_quantity,
                   (ulong)(uint)(this->m_session_options).m_outbound_quantity,
                   (ulong)(uint)(this->m_session_options).m_inbound_length,
                   (ulong)(uint)(this->m_session_options).m_outbound_length);
  uVar1 = 400;
  if (uVar2 < 400) {
    uVar1 = uVar2;
  }
  local_200.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.size_ =
       (size_t)uVar1;
  local_200.handler_.m_underlying_handler._M_f = h->_M_f;
  local_200.handler_.m_underlying_handler._8_8_ = *(undefined8 *)&h->field_0x8;
  local_200.handler_.m_underlying_handler._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>)
       (h->_M_bound_args).
       super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
       super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl;
  local_200.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.total_consumed_ = 0;
  local_200.start_ = 0;
  local_210.val_ = 0;
  local_210.failed_ = false;
  local_210.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  local_200.stream_ =
       (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
        *)this;
  local_200.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.data_ = cmd;
  local_200.handler_.m_handler.this = this;
  boost::asio::detail::
  write_op<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_libtorrent::aux::wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:433:4),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>_>
  ::operator()(&local_200,&local_210,0,1);
  return;
}

Assistant:

void send_session_create(Handler h)
	{
		TORRENT_ASSERT(m_magic == 0x1337);
		m_state = read_session_create_response;
		char cmd[400];
		int size = std::snprintf(cmd, sizeof(cmd),
			"SESSION CREATE STYLE=STREAM ID=%s "
			"DESTINATION=TRANSIENT SIGNATURE_TYPE=7 i2cp.leaseSetEncType=4,0 "
			"inbound.quantity=%d outbound.quantity=%d inbound.length=%d outbound.length=%d\n",
			m_id, m_session_options.m_inbound_quantity, m_session_options.m_outbound_quantity,
			m_session_options.m_inbound_length, m_session_options.m_outbound_length);
		ADD_OUTSTANDING_ASYNC("i2p_stream::start_read_line");
		async_write(m_sock, boost::asio::buffer(cmd, std::size_t(size)), aux::wrap_allocator(
			[this](error_code const& ec, std::size_t, Handler hn) {
				start_read_line(ec, std::move(hn));
			}, std::move(h)));
	}